

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

int cpu_memory_rw_debug_mips
              (CPUState *cpu,target_ulong addr,void *ptr,target_ulong len,_Bool is_write)

{
  hwaddr hVar1;
  MemTxAttrs local_a8;
  int local_a4;
  MemTxAttrs attrs;
  int asidx;
  uint8_t *buf;
  target_ulong page;
  hwaddr phys_addr;
  _Bool is_write_local;
  void *ptr_local;
  CPUState *cpu_local;
  FlatView *fv;
  MemoryRegion *mr;
  void *ptr_1;
  hwaddr addr1;
  hwaddr l_1;
  MemTxResult result;
  
  ptr_local._4_4_ = (uint)addr;
  phys_addr._4_4_ = (uint)len;
  _attrs = ptr;
  while( true ) {
    if (phys_addr._4_4_ == 0) {
      return 0;
    }
    hVar1 = cpu_get_phys_page_attrs_debug(cpu,(ulong)(ptr_local._4_4_ & 0xfffff000),&local_a8);
    local_a4 = cpu_asidx_from_attrs(cpu,local_a8);
    if (hVar1 == 0xffffffffffffffff) break;
    buf._4_4_ = ((ptr_local._4_4_ & 0xfffff000) + 0x1000) - ptr_local._4_4_;
    if (phys_addr._4_4_ < buf._4_4_) {
      buf._4_4_ = phys_addr._4_4_;
    }
    hVar1 = (ptr_local._4_4_ & 0xfff) + hVar1;
    if (is_write) {
      address_space_write_rom_mips
                (cpu->cpu_ases[local_a4].as,hVar1,local_a8,_attrs,(ulong)buf._4_4_);
    }
    else {
      address_space_read_full_mips
                (cpu->cpu_ases[local_a4].as,hVar1,local_a8,_attrs,(ulong)buf._4_4_);
    }
    phys_addr._4_4_ = phys_addr._4_4_ - buf._4_4_;
    _attrs = (void *)((long)_attrs + (ulong)buf._4_4_);
    ptr_local._4_4_ = buf._4_4_ + ptr_local._4_4_;
  }
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}